

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

void duckdb::DateSubFunction<duckdb::dtime_t>(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  bool bVar2;
  undefined1 uVar3;
  reference this;
  reference result_00;
  reference c;
  Vector *in_RDX;
  DataChunk *in_RDI;
  DatePartSpecifier type;
  value_type *end_arg;
  value_type *start_arg;
  value_type *part_arg;
  _func_long_string_t_dtime_t_dtime_t_ValidityMask_ptr_unsigned_long *in_stack_ffffffffffffff48;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  string *count;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  Vector *in_stack_ffffffffffffffa0;
  Vector *in_stack_ffffffffffffffa8;
  DatePartSpecifier in_stack_ffffffffffffffb7;
  
  this = vector<duckdb::Vector,_true>::operator[]
                   (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  c = vector<duckdb::Vector,_true>::operator[]
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  VVar1 = Vector::GetVectorType(this);
  if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = ConstantVector::IsNull((Vector *)0xbe0eee);
    if (bVar2) {
      duckdb::Vector::SetVectorType((VectorType)in_RDX);
      duckdb::ConstantVector::SetNull(in_RDX,true);
    }
    else {
      ConstantVector::GetData<duckdb::string_t>((Vector *)0xbe0f2a);
      count = (string *)&stack0xffffffffffffffa8;
      string_t::GetString_abi_cxx11_
                ((string_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      uVar3 = duckdb::GetDatePartSpecifier(count);
      uVar4 = CONCAT13(uVar3,(int3)in_stack_ffffffffffffff98);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      DataChunk::size(in_RDI);
      DateSubBinaryExecutor<duckdb::dtime_t,duckdb::dtime_t,long>
                (in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (Vector *)CONCAT44(in_stack_ffffffffffffff9c,uVar4),(idx_t)count);
    }
  }
  else {
    DataChunk::size(in_RDI);
    TernaryExecutor::
    ExecuteWithNulls<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long,long(*)(duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)>
              (in_stack_ffffffffffffff70,in_RDX,c,result_00,(idx_t)this,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

static void DateSubFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);
	auto &part_arg = args.data[0];
	auto &start_arg = args.data[1];
	auto &end_arg = args.data[2];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateSubBinaryExecutor<T, T, int64_t>(type, start_arg, end_arg, result, args.size());
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<string_t, T, T, int64_t>(
		    part_arg, start_arg, end_arg, result, args.size(),
		    DateSubTernaryOperator::Operation<string_t, T, T, int64_t>);
	}
}